

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

void onBytesReceived(void *context,uchar *buffer,size_t size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  MQTT_CLIENT *mqtt_client;
  size_t size_local;
  uchar *buffer_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"onBytesReceived",0x1e5,1,"Error: mqtt_client is NULL");
    }
  }
  else {
    iVar1 = mqtt_codec_bytesReceived(*(MQTTCODEC_HANDLE *)((long)context + 8),buffer,size);
    if (iVar1 != 0) {
      mqtt_codec_reset(*(MQTTCODEC_HANDLE *)((long)context + 8));
      set_error_callback((MQTT_CLIENT *)context,MQTT_CLIENT_PARSE_ERROR);
    }
  }
  return;
}

Assistant:

static void onBytesReceived(void* context, const unsigned char* buffer, size_t size)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)context;
    if (mqtt_client != NULL)
    {
        if (mqtt_codec_bytesReceived(mqtt_client->codec_handle, buffer, size) != 0)
        {
            mqtt_codec_reset(mqtt_client->codec_handle);
            set_error_callback(mqtt_client, MQTT_CLIENT_PARSE_ERROR);
        }
    }
    else
    {
        LogError("Error: mqtt_client is NULL");
    }
}